

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O1

uint8_t precedenceOf(SyntaxKind tkK)

{
  if ((ushort)(tkK - AsteriskToken) < 0x22) {
    return (&DAT_004717a8)[(ushort)(tkK - AsteriskToken)];
  }
  return '\0';
}

Assistant:

std::uint8_t precedenceOf(SyntaxKind tkK)
{
    switch (tkK) {
        case SyntaxKind::CommaToken:
            return NAryPrecedence::Sequencing;

        case SyntaxKind::EqualsToken:
        case SyntaxKind::PlusEqualsToken:
        case SyntaxKind::MinusEqualsToken:
        case SyntaxKind::AsteriskEqualsToken:
        case SyntaxKind::SlashEqualsToken:
        case SyntaxKind::PercentEqualsToken:
        case SyntaxKind::LessThanLessThanEqualsToken:
        case SyntaxKind::GreaterThanGreaterThanEqualsToken:
        case SyntaxKind::AmpersandEqualsToken:
        case SyntaxKind::CaretEqualsToken:
        case SyntaxKind::BarEqualsToken:
            return NAryPrecedence::Assignment;

        case SyntaxKind::QuestionToken:
            return NAryPrecedence::Conditional;

        case SyntaxKind::BarBarToken:
            return NAryPrecedence::LogicalOR;

        case SyntaxKind::AmpersandAmpersandToken:
            return NAryPrecedence::LogicalAND;

        case SyntaxKind::BarToken:
            return NAryPrecedence::BitwiseOR;

        case SyntaxKind::CaretToken:
            return NAryPrecedence::BitwiseXOR;

        case SyntaxKind::AmpersandToken:
            return NAryPrecedence::BitwiseAND;

        case SyntaxKind::EqualsEqualsToken:
        case SyntaxKind::ExclamationEqualsToken:
            return NAryPrecedence::Equality;

        case SyntaxKind::GreaterThanToken:
        case SyntaxKind::LessThanToken:
        case SyntaxKind::LessThanEqualsToken:
        case SyntaxKind::GreaterThanEqualsToken:
            return NAryPrecedence::Relational;

        case SyntaxKind::LessThanLessThanToken:
        case SyntaxKind::GreaterThanGreaterThanToken:
            return NAryPrecedence::Shift;

        case SyntaxKind::PlusToken:
        case SyntaxKind::MinusToken:
            return NAryPrecedence::Additive;

        case SyntaxKind::AsteriskToken:
        case SyntaxKind::SlashToken:
        case SyntaxKind::PercentToken:
            return NAryPrecedence::Multiplicative;

        default:
            return NAryPrecedence::Undefined;
    }
}